

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

vector<int,_std::allocator<int>_> *
JSON::parseIntArray(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *json)

{
  char cVar1;
  iterator iVar2;
  uint uVar3;
  ulong uVar4;
  int curid;
  int local_2c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(json->_M_dataplus)._M_p == '[') {
    local_2c = 0;
    uVar3 = (uint)json->_M_string_length;
    if (1 < (int)uVar3) {
      uVar4 = 1;
      do {
        cVar1 = (json->_M_dataplus)._M_p[uVar4];
        if (cVar1 != ' ') {
          if (cVar1 == ',') {
            iVar2._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,&local_2c);
            }
            else {
              *iVar2._M_current = local_2c;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            local_2c = 0;
          }
          else {
            if (cVar1 == ']') {
              iVar2._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current !=
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar2._M_current = local_2c;
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                return __return_storage_ptr__;
              }
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar2,&local_2c);
              return __return_storage_ptr__;
            }
            local_2c = (int)cVar1 + local_2c * 10 + -0x30;
          }
        }
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> parseIntArray(const std::string & json) {
    std::vector<int> res;
    if (json[0] != '[') return res;

    int n = json.size();
    int curid = 0;
    for (int i = 1; i < n; ++i) {
        if (json[i] == ' ') continue;
        if (json[i] == ',') {
            res.push_back(curid);
            curid = 0;
            continue;
        }

        if (json[i] == ']') {
            res.push_back(curid);
            break;
        }

        curid = 10*curid + json[i] - 48;
    }

    return res;
}